

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SqueezeLayerParams::~SqueezeLayerParams(SqueezeLayerParams *this)

{
  SqueezeLayerParams *this_local;
  
  ~SqueezeLayerParams(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

SqueezeLayerParams::~SqueezeLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.SqueezeLayerParams)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}